

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Dictionary.h
# Opt level: O0

void __thiscall
Refal2::
CDictionary<std::unique_ptr<Refal2::CPreparatoryFunction,_std::default_delete<Refal2::CPreparatoryFunction>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
::~CDictionary(CDictionary<std::unique_ptr<Refal2::CPreparatoryFunction,_std::default_delete<Refal2::CPreparatoryFunction>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *this)

{
  CDictionary<std::unique_ptr<Refal2::CPreparatoryFunction,_std::default_delete<Refal2::CPreparatoryFunction>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *this_local;
  
  Free(this);
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
  ::~map(&this->keyToIndex);
  return;
}

Assistant:

~CDictionary() { Free(); }